

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::receivefile(int sender,uchar *data,int len)

{
  clientinfo *ci;
  char *pcVar1;
  
  ci = getinfo(sender);
  if ((((0x19 < gamemode + 3U) || (len - 0x400001U < 0xffc00000 || gamemode != 1)) ||
      ((instacoop != 0 && (ci->privilege != 3)))) ||
     ((((ci->state).state == 5 && (ci->privilege == 0)) && (ci->local != true)))) {
    return;
  }
  if (mapdata != (stream *)0x0) {
    (*mapdata->_vptr_stream[1])();
    mapdata = (stream *)0x0;
  }
  mapdata = opentempfile("mapdata","w+b");
  if (mapdata != (stream *)0x0) {
    (*mapdata->_vptr_stream[10])(mapdata,data,(ulong)(uint)len);
    pcVar1 = colorname(ci);
    sendservmsgf("\f0%s \f7uploaded a map to the server, type \f2\"/getmap\" \f7to receive it",
                 pcVar1);
    return;
  }
  sendf(sender,1,"ris",0x23,"\f3Error: Failed to open temporary file for map");
  return;
}

Assistant:

void receivefile(int sender, uchar *data, int len)
    {
        clientinfo *ci = getinfo(sender);
        if(!m_edit || len <= 0 || len > 4*1024*1024 || (instacoop && ci->privilege != PRIV_ADMIN)) return; //ignore empty sendmaps/instacoop w/o admin
        if(ci->state.state==CS_SPECTATOR && !ci->privilege && !ci->local) return;
        if(mapdata) DELETEP(mapdata);
        mapdata = opentempfile("mapdata", "w+b");
        if(!mapdata) {sendf(sender, 1, "ris", N_SERVMSG, "\f3Error: Failed to open temporary file for map"); return;}
        mapdata->write(data, len);
        sendservmsgf("\f0%s \f7uploaded a map to the server, type \f2\"/getmap\" \f7to receive it", colorname(ci));
    }